

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O1

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixUp
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  pointer pcVar1;
  student *psVar2;
  bool bVar3;
  student *psVar4;
  ulong uVar5;
  student tmp;
  student local_68;
  
  local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
  psVar2 = this->mData + idx;
  pcVar1 = (psVar2->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (psVar2->name)._M_string_length);
  std::vector<int,_std::allocator<int>_>::vector(&local_68.scores,&psVar2->scores);
  while (idx != 0) {
    uVar5 = idx - 1 >> 1;
    bVar3 = student::operator<(&local_68,this->mData + uVar5);
    if (bVar3) goto LAB_00102d63;
    psVar2 = this->mData;
    psVar4 = psVar2 + idx;
    std::__cxx11::string::_M_assign((string *)psVar4);
    std::vector<int,_std::allocator<int>_>::operator=(&psVar4->scores,&psVar2[uVar5].scores);
    idx = uVar5;
  }
  idx = 0;
LAB_00102d63:
  psVar2 = this->mData;
  std::__cxx11::string::_M_assign((string *)(psVar2 + idx));
  std::vector<int,_std::allocator<int>_>::operator=(&psVar2[idx].scores,&local_68.scores);
  if (local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }